

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

value_type pugi::impl::anon_unknown_0::utf8_writer::high(value_type result,uint32_t ch)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2 = vpinsrb_avx(ZEXT416(ch >> 0x12),ch >> 0xc & 0xffffff3f,1);
  auVar2 = vpinsrb_avx(auVar2,ch >> 6 & 0xffffff3f,2);
  auVar2 = vpinsrb_avx(auVar2,ch & 0xffffff3f,3);
  auVar1._8_4_ = 0x808080f0;
  auVar1._0_8_ = 0x808080f0808080f0;
  auVar1._12_4_ = 0x808080f0;
  auVar2 = vpord_avx512vl(auVar2,auVar1);
  *(int *)result = auVar2._0_4_;
  return result + 4;
}

Assistant:

static value_type high(value_type result, uint32_t ch)
		{
			// U+10000..U+10FFFF
			result[0] = static_cast<uint8_t>(0xF0 | (ch >> 18));
			result[1] = static_cast<uint8_t>(0x80 | ((ch >> 12) & 0x3F));
			result[2] = static_cast<uint8_t>(0x80 | ((ch >> 6) & 0x3F));
			result[3] = static_cast<uint8_t>(0x80 | (ch & 0x3F));
			return result + 4;
		}